

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O1

int32_t u_getIntPropertyValue_63(UChar32 c,UProperty which)

{
  char cVar1;
  byte bVar2;
  int8_t iVar3;
  uint16_t uVar4;
  UCharDirection UVar5;
  UJoiningGroup UVar6;
  UJoiningType UVar7;
  int iVar8;
  UScriptCode UVar9;
  uint uVar10;
  UNormalizationCheckResult UVar11;
  UBidiPairedBracketType UVar12;
  uint32_t uVar13;
  long lVar14;
  UHangulSyllableType UVar15;
  
  if (which < UCHAR_BIDI_CLASS) {
    if ((uint)which < 0x41) {
      cVar1 = (*(code *)(&switchD_002f34dd::switchdataD_003f7d88)[(ulong)(uint)which * 2])
                        (&binProps + (ulong)(uint)which * 2);
      return (int)cVar1;
    }
  }
  else {
    if (which < UCHAR_INT_LIMIT) {
      lVar14 = (ulong)(uint)(which + 0xfffff000) * 0x20;
      switch(which) {
      case UCHAR_BIDI_CLASS:
        UVar5 = u_charDirection_63(c);
        return UVar5;
      default:
        uVar13 = u_getUnicodeProperties_63(c,*(int32_t *)(&intProps + lVar14));
        return (int)(uVar13 & *(uint *)(&DAT_003f8194 + lVar14)) >> ((&UNK_003f8198)[lVar14] & 0x1f)
        ;
      case UCHAR_CANONICAL_COMBINING_CLASS:
        bVar2 = u_getCombiningClass_63(c);
        return (int32_t)bVar2;
      case UCHAR_GENERAL_CATEGORY:
        iVar3 = u_charType_63(c);
        return (int)iVar3;
      case UCHAR_JOINING_GROUP:
        UVar6 = ubidi_getJoiningGroup_63(c);
        return UVar6;
      case UCHAR_JOINING_TYPE:
        UVar7 = ubidi_getJoiningType_63(c);
        return UVar7;
      case UCHAR_NUMERIC_TYPE:
        uVar13 = u_getMainProperties_63(c);
        iVar8 = 0;
        if ((0x3f < uVar13) && (iVar8 = 1, 0x2bf < uVar13)) {
          iVar8 = 3 - (uint)(uVar13 < 0x540);
        }
        break;
      case UCHAR_SCRIPT:
        UVar9 = uscript_getScript_63(c,(UErrorCode *)&stack0xfffffffffffffffc);
        return UVar9;
      case UCHAR_HANGUL_SYLLABLE_TYPE:
        uVar13 = u_getUnicodeProperties_63(c,2);
        uVar10 = uVar13 >> 5 & 0x1f;
        UVar15 = U_HST_NOT_APPLICABLE;
        if (uVar10 < 10) {
          UVar15 = gcbToHst[uVar10];
        }
        return UVar15;
      case UCHAR_NFD_QUICK_CHECK:
      case UCHAR_NFKD_QUICK_CHECK:
      case UCHAR_NFC_QUICK_CHECK:
      case UCHAR_NFKC_QUICK_CHECK:
        UVar11 = unorm_getQuickCheck_63(c,which - 0x100a);
        return UVar11;
      case UCHAR_LEAD_CANONICAL_COMBINING_CLASS:
        uVar4 = unorm_getFCD16_63(c);
        return (uint)(uVar4 >> 8);
      case UCHAR_TRAIL_CANONICAL_COMBINING_CLASS:
        uVar4 = unorm_getFCD16_63(c);
        return (int32_t)(byte)uVar4;
      case UCHAR_BIDI_PAIRED_BRACKET_TYPE:
        UVar12 = ubidi_getPairedBracketType_63(c);
        return UVar12;
      case UCHAR_INDIC_POSITIONAL_CATEGORY:
        uVar13 = ucptrie_get_63(&inpc_trie,c);
        return uVar13;
      case UCHAR_INDIC_SYLLABIC_CATEGORY:
        uVar13 = ucptrie_get_63(&insc_trie,c);
        return uVar13;
      case UCHAR_VERTICAL_ORIENTATION:
        uVar13 = ucptrie_get_63(&vo_trie,c);
        return uVar13;
      }
      return iVar8;
    }
    if (which == UCHAR_GENERAL_CATEGORY_MASK) {
      bVar2 = u_charType_63(c);
      return 1 << (bVar2 & 0x1f);
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_getIntPropertyValue(UChar32 c, UProperty which) {
    if(which<UCHAR_INT_START) {
        if(UCHAR_BINARY_START<=which && which<UCHAR_BINARY_LIMIT) {
            const BinaryProperty &prop=binProps[which];
            return prop.contains(prop, c, which);
        }
    } else if(which<UCHAR_INT_LIMIT) {
        const IntProperty &prop=intProps[which-UCHAR_INT_START];
        return prop.getValue(prop, c, which);
    } else if(which==UCHAR_GENERAL_CATEGORY_MASK) {
        return U_MASK(u_charType(c));
    }
    return 0;  // undefined
}